

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O1

void YM2612_Write(ym2612_ *YM2612,UINT8 adr,UINT8 data)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  
  switch(adr & 3) {
  case 0:
    YM2612->OPNAadr = (uint)data;
    break;
  case 1:
    lVar3 = (long)YM2612->OPNAadr;
    if (lVar3 == 0x2a) {
switchD_00136e53_caseD_2a:
      YM2612->DACdata = (uint)data * 0x40 + -0x2000;
      return;
    }
    uVar1 = YM2612->OPNAadr & 0xf0;
    if (0x2f < uVar1) {
      if (YM2612->REG[0][lVar3] == data) {
        return;
      }
      YM2612->REG[0][lVar3] = data;
      iVar6 = YM2612->OPNAadr;
      goto joined_r0x00136db6;
    }
    YM2612->REG[0][lVar3] = data;
    switch(YM2612->OPNAadr) {
    case 0x22:
      if ((data & 8) == 0) {
        YM2612->LFOcnt = 0;
        YM2612->LFOinc = 0;
      }
      else {
        YM2612->LFOinc = YM2612->LFO_INC_TAB[data & 7];
      }
      break;
    case 0x24:
      iVar6 = (YM2612->TimerA & 3U) + (uint)data * 4;
      YM2612->TimerA = iVar6;
      iVar6 = iVar6 * -0x1000 + 0x400000;
      if (YM2612->TimerAL == iVar6) {
        return;
      }
      goto LAB_00136fa6;
    case 0x25:
      uVar2 = (uint)(data & 3) | YM2612->TimerA & 0x3fcU;
      YM2612->TimerA = uVar2;
      iVar6 = uVar2 * -0x1000 + 0x400000;
      if (YM2612->TimerAL == iVar6) {
        return;
      }
LAB_00136fa6:
      YM2612->TimerAL = iVar6;
      YM2612->TimerAcnt = iVar6;
      break;
    case 0x26:
      YM2612->TimerB = (uint)data;
      iVar6 = (uint)data * -0x10000 + 0x1000000;
      if (YM2612->TimerBL != iVar6) {
        YM2612->TimerBL = iVar6;
        YM2612->TimerBcnt = iVar6;
      }
      break;
    case 0x27:
      if (((YM2612->Mode ^ data) & 0x40) != 0) {
        YM2612_Update(YM2612,(DEV_SMPL **)0x0,0);
        YM2612->CHANNEL[2].SLOT[0].Finc = -1;
      }
      YM2612->Status = YM2612->Status & (uint)(data >> 2) & ~(uint)(data >> 4);
      YM2612->Mode = data;
      break;
    case 0x28:
      uVar2 = data & 3;
      if (uVar2 == 3) {
        return;
      }
      uVar1 = uVar2 + 3;
      if ((data & 4) == 0) {
        uVar1 = uVar2;
      }
      YM2612_Update(YM2612,(DEV_SMPL **)0x0,0);
      iVar6 = YM2612->CHANNEL[uVar1].SLOT[0].Ecurp;
      if ((data & 0x10) == 0) {
        if (iVar6 != 3) {
          iVar6 = YM2612->CHANNEL[uVar1].SLOT[0].Ecnt;
          if (iVar6 < 0x10000000) {
            YM2612->CHANNEL[uVar1].SLOT[0].Ecnt = ENV_TAB[iVar6 >> 0x10] * 0x10000 + 0x10000000;
          }
          piVar4 = &YM2612->CHANNEL[uVar1].SLOT[0].EincR;
          iVar6 = 3;
          iVar5 = 0x20000000;
LAB_00137045:
          YM2612->CHANNEL[uVar1].SLOT[0].Einc = *piVar4;
          YM2612->CHANNEL[uVar1].SLOT[0].Ecmp = iVar5;
          YM2612->CHANNEL[uVar1].SLOT[0].Ecurp = iVar6;
        }
      }
      else if (iVar6 == 3) {
        YM2612->CHANNEL[uVar1].SLOT[0].Fcnt = 0;
        YM2612->CHANNEL[uVar1].SLOT[0].Ecnt =
             YM2612->CHANNEL[uVar1].SLOT[0].ChgEnM &
             DECAY_TO_ATTACK[ENV_TAB[*(short *)((long)&YM2612->CHANNEL[uVar1].SLOT[0].Ecnt + 2)]];
        YM2612->CHANNEL[uVar1].SLOT[0].ChgEnM = -1;
        piVar4 = &YM2612->CHANNEL[uVar1].SLOT[0].EincA;
        iVar6 = 0;
        iVar5 = 0x10000000;
        goto LAB_00137045;
      }
      iVar6 = YM2612->CHANNEL[uVar1].SLOT[2].Ecurp;
      if ((data & 0x20) == 0) {
        if (iVar6 != 3) {
          iVar6 = YM2612->CHANNEL[uVar1].SLOT[2].Ecnt;
          if (iVar6 < 0x10000000) {
            YM2612->CHANNEL[uVar1].SLOT[2].Ecnt = ENV_TAB[iVar6 >> 0x10] * 0x10000 + 0x10000000;
          }
          piVar4 = &YM2612->CHANNEL[uVar1].SLOT[2].EincR;
          iVar6 = 3;
          iVar5 = 0x20000000;
LAB_00137103:
          YM2612->CHANNEL[uVar1].SLOT[2].Einc = *piVar4;
          YM2612->CHANNEL[uVar1].SLOT[2].Ecmp = iVar5;
          YM2612->CHANNEL[uVar1].SLOT[2].Ecurp = iVar6;
        }
      }
      else if (iVar6 == 3) {
        YM2612->CHANNEL[uVar1].SLOT[2].Fcnt = 0;
        YM2612->CHANNEL[uVar1].SLOT[2].Ecnt =
             YM2612->CHANNEL[uVar1].SLOT[2].ChgEnM &
             DECAY_TO_ATTACK[ENV_TAB[*(short *)((long)&YM2612->CHANNEL[uVar1].SLOT[2].Ecnt + 2)]];
        YM2612->CHANNEL[uVar1].SLOT[2].ChgEnM = -1;
        piVar4 = &YM2612->CHANNEL[uVar1].SLOT[2].EincA;
        iVar6 = 0;
        iVar5 = 0x10000000;
        goto LAB_00137103;
      }
      iVar6 = YM2612->CHANNEL[uVar1].SLOT[1].Ecurp;
      if ((data & 0x40) == 0) {
        if (iVar6 != 3) {
          iVar6 = YM2612->CHANNEL[uVar1].SLOT[1].Ecnt;
          if (iVar6 < 0x10000000) {
            YM2612->CHANNEL[uVar1].SLOT[1].Ecnt = ENV_TAB[iVar6 >> 0x10] * 0x10000 + 0x10000000;
          }
          piVar4 = &YM2612->CHANNEL[uVar1].SLOT[1].EincR;
          iVar6 = 3;
          iVar5 = 0x20000000;
LAB_001371c1:
          YM2612->CHANNEL[uVar1].SLOT[1].Einc = *piVar4;
          YM2612->CHANNEL[uVar1].SLOT[1].Ecmp = iVar5;
          YM2612->CHANNEL[uVar1].SLOT[1].Ecurp = iVar6;
        }
      }
      else if (iVar6 == 3) {
        YM2612->CHANNEL[uVar1].SLOT[1].Fcnt = 0;
        YM2612->CHANNEL[uVar1].SLOT[1].Ecnt =
             YM2612->CHANNEL[uVar1].SLOT[1].ChgEnM &
             DECAY_TO_ATTACK[ENV_TAB[*(short *)((long)&YM2612->CHANNEL[uVar1].SLOT[1].Ecnt + 2)]];
        YM2612->CHANNEL[uVar1].SLOT[1].ChgEnM = -1;
        piVar4 = &YM2612->CHANNEL[uVar1].SLOT[1].EincA;
        iVar6 = 0;
        iVar5 = 0x10000000;
        goto LAB_001371c1;
      }
      iVar6 = YM2612->CHANNEL[uVar1].SLOT[3].Ecurp;
      if ((char)data < '\0') {
        if (iVar6 == 3) {
          YM2612->CHANNEL[uVar1].SLOT[3].Fcnt = 0;
          iVar6 = YM2612->CHANNEL[uVar1].SLOT[3].EincA;
          YM2612->CHANNEL[uVar1].SLOT[3].Ecnt =
               YM2612->CHANNEL[uVar1].SLOT[3].ChgEnM &
               DECAY_TO_ATTACK[ENV_TAB[*(short *)((long)&YM2612->CHANNEL[uVar1].SLOT[3].Ecnt + 2)]];
          YM2612->CHANNEL[uVar1].SLOT[3].ChgEnM = -1;
          YM2612->CHANNEL[uVar1].SLOT[3].Einc = iVar6;
          YM2612->CHANNEL[uVar1].SLOT[3].Ecmp = 0x10000000;
          YM2612->CHANNEL[uVar1].SLOT[3].Ecurp = 0;
        }
      }
      else if (iVar6 != 3) {
        iVar6 = YM2612->CHANNEL[uVar1].SLOT[3].Ecnt;
        if (iVar6 < 0x10000000) {
          YM2612->CHANNEL[uVar1].SLOT[3].Ecnt = ENV_TAB[iVar6 >> 0x10] * 0x10000 + 0x10000000;
        }
        YM2612->CHANNEL[uVar1].SLOT[3].Einc = YM2612->CHANNEL[uVar1].SLOT[3].EincR;
        YM2612->CHANNEL[uVar1].SLOT[3].Ecmp = 0x20000000;
        YM2612->CHANNEL[uVar1].SLOT[3].Ecurp = 3;
      }
      break;
    case 0x2a:
      goto switchD_00136e53_caseD_2a;
    case 0x2b:
      if (YM2612->DAC != (data & 0x80)) {
        YM2612_Update(YM2612,(DEV_SMPL **)0x0,0);
      }
      YM2612->DAC = data & 0x80;
    }
    break;
  case 2:
    YM2612->OPNBadr = (uint)data;
    break;
  case 3:
    uVar2 = YM2612->OPNBadr;
    uVar1 = uVar2 & 0xf0;
    if ((0x2f < uVar1) && (YM2612->REG[1][(int)uVar2] != data)) {
      YM2612->REG[1][(int)uVar2] = data;
      iVar6 = YM2612->OPNBadr + 0x100;
joined_r0x00136db6:
      if (uVar1 < 0xa0) {
        SLOT_SET(YM2612,iVar6,data);
        return;
      }
      CHANNEL_SET(YM2612,iVar6,data);
      return;
    }
  }
  return;
}

Assistant:

void YM2612_Write(ym2612_ *YM2612, UINT8 adr, UINT8 data)
{
  /**
   * Possible addresses:
   * - 0: Part 1 register number.
   * - 1: Part 1 data.
   * - 2: Part 2 register number.
   * - 3: Part 2 data.
   */

  int d;
  switch (adr & 0x03)
  {
    case 0:
      YM2612->OPNAadr = data;
      break;

    case 1:
      // Trivial optimisation
      if (YM2612->OPNAadr == 0x2A)
      {
        YM2612->DACdata = ((int)data - 0x80) << DAC_SHIFT;
        return /*0*/;
      }

      d = YM2612->OPNAadr & 0xF0;

      if (d >= 0x30)
      {
        if (YM2612->REG[0][YM2612->OPNAadr] == data)
          return /*2*/;
        YM2612->REG[0][YM2612->OPNAadr] = data;

        if (d < 0xA0)    // SLOT
        {
          SLOT_SET(YM2612, YM2612->OPNAadr, data);
        }
        else        // CHANNEL
        {
          CHANNEL_SET(YM2612, YM2612->OPNAadr, data);
        }
      }
      else          // YM2612
      {
        YM2612->REG[0][YM2612->OPNAadr] = data;

        YM_SET(YM2612, YM2612->OPNAadr, data);
      }
      break;

    case 2:
      YM2612->OPNBadr = data;
      break;

    case 3:
      d = YM2612->OPNBadr & 0xF0;

      if (d >= 0x30)
      {
        if (YM2612->REG[1][YM2612->OPNBadr] == data)
          return /*2*/;
        YM2612->REG[1][YM2612->OPNBadr] = data;

        if (d < 0xA0)    // SLOT
        {
          SLOT_SET(YM2612, YM2612->OPNBadr + 0x100, data);
        }
        else        // CHANNEL
        {
          CHANNEL_SET(YM2612, YM2612->OPNBadr + 0x100, data);
        }
      }
      else
        return /*1*/;
      break;
  }

  return /*0*/;
}